

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O0

json_t * gravity_compiler_serialize(gravity_compiler_t *compiler,gravity_closure_t *closure)

{
  json_t *json;
  gravity_closure_t *closure_local;
  gravity_compiler_t *compiler_local;
  
  if (closure == (gravity_closure_t *)0x0) {
    compiler_local = (gravity_compiler_t *)0x0;
  }
  else {
    compiler_local = (gravity_compiler_t *)json_new();
    json_begin_object((json_t *)compiler_local,(char *)0x0);
    gravity_function_serialize(closure->f,(json_t *)compiler_local);
    json_end_object((json_t *)compiler_local);
  }
  return (json_t *)compiler_local;
}

Assistant:

json_t *gravity_compiler_serialize (gravity_compiler_t *compiler, gravity_closure_t *closure) {
    #pragma unused(compiler)
    if (!closure) return NULL;

    json_t *json = json_new();
    json_begin_object(json, NULL);

    gravity_function_serialize(closure->f, json);

    json_end_object(json);
    return json;
}